

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::App::App(App *this,string *app_description,string *app_name,App *parent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Rb_tree_header *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pcVar3;
  Option *pOVar4;
  App *pAVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char cVar11;
  bool bVar12;
  MultiOptionPolicy MVar13;
  element_type *__p;
  ConfigBase *__p_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  string local_70;
  string local_50;
  
  this->_vptr_App = (_func_int **)&PTR__App_001571b8;
  paVar14 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar14;
  pcVar3 = (app_name->_M_dataplus)._M_p;
  paVar1 = &app_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar6 = *(undefined8 *)((long)&app_name->field_2 + 8);
    paVar14->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar6;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar3;
    paVar14->_M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = app_name->_M_string_length;
  (app_name->_M_dataplus)._M_p = (pointer)paVar1;
  app_name->_M_string_length = 0;
  (app_name->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->description_).field_2;
  (this->description_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (app_description->_M_dataplus)._M_p;
  paVar14 = &app_description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar14) {
    uVar6 = *(undefined8 *)((long)&app_description->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar14->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->description_).field_2 + 8) = uVar6;
  }
  else {
    (this->description_)._M_dataplus._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  (this->description_)._M_string_length = app_description->_M_string_length;
  (app_description->_M_dataplus)._M_p = (pointer)paVar14;
  app_description->_M_string_length = 0;
  (app_description->field_2)._M_local_buf[0] = '\0';
  this->allow_extras_ = false;
  this->allow_config_extras_ = ignore;
  memset(&this->prefix_command_,0,0x86);
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_._M_dataplus._M_p =
       (pointer)&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_.field_2;
  *(undefined4 *)&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_.field_2 =
       0x6974704f;
  *(undefined4 *)
   ((long)&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_.field_2 + 3) =
       0x736e6f69;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_._M_string_length = 7;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.required_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.configurable_ = true;
  *(undefined8 *)
   &(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.disable_flag_override_ = 0;
  *(undefined8 *)
   ((long)&(this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->options_).
  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options_).
  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->footer_)._M_dataplus._M_p = (pointer)&(this->footer_).field_2;
  (this->footer_)._M_string_length = 0;
  (this->footer_).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->footer_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->footer_callback_).super__Function_base._M_functor + 8) = 0;
  (this->footer_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->footer_callback_)._M_invoker = (_Invoker_type)0x0;
  this->help_ptr_ = (Option *)0x0;
  this->help_all_ptr_ = (Option *)0x0;
  __p = (element_type *)operator_new(0x40);
  __p->column_width_ = 0x1e;
  p_Var2 = &(__p->labels_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__p->labels_)._M_t._M_impl = 0;
  *(undefined8 *)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(_Base_ptr *)((long)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)((long)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var2;
  *(_Rb_tree_header **)((long)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var2;
  (__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ((FormatterBase *)&__p->_vptr_FormatterBase)->_vptr_FormatterBase =
       (_func_int **)&PTR__FormatterBase_00156f50;
  (this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p
  ;
  this_00 = &(this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CLI::Formatter*>
            (this_00,(Formatter *)__p);
  *(undefined8 *)((long)&(this->failure_message_).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->failure_message_).super__Function_base._M_functor =
       FailureMessage::simple_abi_cxx11_;
  (this->failure_message_)._M_invoker =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_CLI::App_*,_const_CLI::Error_&)>
       ::_M_invoke;
  (this->failure_message_).super__Function_base._M_manager =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_CLI::App_*,_const_CLI::Error_&)>
       ::_M_manager;
  p_Var2 = &(this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->exclude_subcommands_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  p_Var2 = &(this->exclude_options_)._M_t._M_impl.super__Rb_tree_header;
  (this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->exclude_options_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->exclude_options_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->exclude_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exclude_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->exclude_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  p_Var2 = &(this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header;
  (this->exclude_options_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->need_subcommands_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  p_Var2 = &(this->need_options_)._M_t._M_impl.super__Rb_tree_header;
  (this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->need_options_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->need_options_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->need_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->need_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->need_options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->need_options_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->subcommands_).
  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subcommands_).
  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subcommands_).
  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->ignore_case_ = false;
  this->ignore_underscore_ = false;
  this->fallthrough_ = false;
  this->allow_windows_style_options_ = false;
  this->positionals_at_end_ = false;
  this->default_startup = stable;
  this->configurable_ = false;
  this->validate_positionals_ = false;
  this->parent_ = parent;
  this->require_option_max_ = 0;
  this->require_subcommand_max_ = 0;
  this->require_option_min_ = 0;
  this->parsed_ = 0;
  this->require_subcommand_min_ = 0;
  (this->group_)._M_dataplus._M_p = (pointer)&(this->group_).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->group_,"Subcommands","");
  (this->aliases_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->config_ptr_ = (Option *)0x0;
  (this->aliases_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __p_00 = (ConfigBase *)operator_new(0x28);
  (__p_00->super_Config)._vptr_Config = (_func_int **)0x0;
  (__p_00->super_Config).items.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->super_Config).items.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->super_Config).items.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __p_00->commentChar = '\0';
  __p_00->arrayStart = '\0';
  __p_00->arrayEnd = '\0';
  __p_00->arraySeparator = '\0';
  __p_00->valueDelimiter = '\0';
  *(undefined3 *)&__p_00->field_0x25 = 0;
  (__p_00->super_Config)._vptr_Config = (_func_int **)&PTR_to_config_00156ef0;
  __p_00->commentChar = ';';
  __p_00->arrayEnd = '\0';
  __p_00->arraySeparator = ' ';
  __p_00->valueDelimiter = '=';
  (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__p_00;
  this_01 = &(this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CLI::ConfigBase*>
            (this_01,__p_00);
  if (this->parent_ != (App *)0x0) {
    pOVar4 = this->parent_->help_ptr_;
    if (pOVar4 != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_50,pOVar4,false,true);
      set_help_flag(this,&local_50,&this->parent_->help_ptr_->description_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    pOVar4 = this->parent_->help_all_ptr_;
    if (pOVar4 != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_70,pOVar4,false,true);
      set_help_all_flag(this,&local_70,&this->parent_->help_all_ptr_->description_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    pAVar5 = this->parent_;
    ::std::__cxx11::string::_M_assign((string *)&this->option_defaults_);
    bVar7 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_;
    bVar8 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_;
    bVar9 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.configurable_;
    bVar10 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.disable_flag_override_
    ;
    cVar11 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.delimiter_;
    bVar12 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.
             always_capture_default_;
    MVar13 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.multi_option_policy_;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.required_ =
         (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.required_;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = bVar7;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = bVar8;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.configurable_ = bVar9;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.disable_flag_override_ = bVar10;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.delimiter_ = cVar11;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.always_capture_default_ = bVar12;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.multi_option_policy_ = MVar13;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
    ::operator=(&this->failure_message_,&this->parent_->failure_message_);
    pAVar5 = this->parent_;
    this->allow_extras_ = pAVar5->allow_extras_;
    this->allow_config_extras_ = pAVar5->allow_config_extras_;
    this->prefix_command_ = pAVar5->prefix_command_;
    this->immediate_callback_ = pAVar5->immediate_callback_;
    this->validate_positionals_ = pAVar5->validate_positionals_;
    this->configurable_ = pAVar5->configurable_;
    bVar7 = pAVar5->ignore_underscore_;
    bVar8 = pAVar5->fallthrough_;
    bVar9 = pAVar5->allow_windows_style_options_;
    this->ignore_case_ = pAVar5->ignore_case_;
    this->ignore_underscore_ = bVar7;
    this->fallthrough_ = bVar8;
    this->allow_windows_style_options_ = bVar9;
    ::std::__cxx11::string::_M_assign((string *)&this->group_);
    ::std::__cxx11::string::_M_assign((string *)&this->footer_);
    pAVar5 = this->parent_;
    (this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pAVar5->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&(pAVar5->formatter_).
                        super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    pAVar5 = this->parent_;
    (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pAVar5->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,&(pAVar5->config_formatter_).
                        super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this->require_subcommand_max_ = this->parent_->require_subcommand_max_;
  }
  return;
}

Assistant:

App(std::string app_description, std::string app_name, App *parent)
        : name_(std::move(app_name)), description_(std::move(app_description)), parent_(parent) {
        // Inherit if not from a nullptr
        if(parent_ != nullptr) {
            if(parent_->help_ptr_ != nullptr)
                set_help_flag(parent_->help_ptr_->get_name(false, true), parent_->help_ptr_->get_description());
            if(parent_->help_all_ptr_ != nullptr)
                set_help_all_flag(parent_->help_all_ptr_->get_name(false, true),
                                  parent_->help_all_ptr_->get_description());

            /// OptionDefaults
            option_defaults_ = parent_->option_defaults_;

            // INHERITABLE
            failure_message_ = parent_->failure_message_;
            allow_extras_ = parent_->allow_extras_;
            allow_config_extras_ = parent_->allow_config_extras_;
            prefix_command_ = parent_->prefix_command_;
            immediate_callback_ = parent_->immediate_callback_;
            ignore_case_ = parent_->ignore_case_;
            ignore_underscore_ = parent_->ignore_underscore_;
            fallthrough_ = parent_->fallthrough_;
            validate_positionals_ = parent_->validate_positionals_;
            configurable_ = parent_->configurable_;
            allow_windows_style_options_ = parent_->allow_windows_style_options_;
            group_ = parent_->group_;
            footer_ = parent_->footer_;
            formatter_ = parent_->formatter_;
            config_formatter_ = parent_->config_formatter_;
            require_subcommand_max_ = parent_->require_subcommand_max_;
        }
    }